

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

ssize_t __thiscall
Json::FastWriter::write_abi_cxx11_(FastWriter *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  long lVar1;
  Value *in_stack_00000138;
  FastWriter *in_stack_00000140;
  
  lVar1 = CONCAT44(in_register_00000034,__fd);
  std::__cxx11::string::clear();
  writeValue(in_stack_00000140,in_stack_00000138);
  if ((*(byte *)(lVar1 + 0x2a) & 1) == 0) {
    std::__cxx11::string::operator+=((string *)(lVar1 + 8),"\n");
  }
  std::__cxx11::string::string((string *)this,(string *)(lVar1 + 8));
  return (ssize_t)this;
}

Assistant:

JSONCPP_STRING FastWriter::write(const Value& root) {
  document_.clear();
  writeValue(root);
  if (!omitEndingLineFeed_)
    document_ += "\n";
  return document_;
}